

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

ReferenceCounterValueType __thiscall
Diligent::RefCountedObject<Diligent::IResourceMapping>::AddRef
          (RefCountedObject<Diligent::IResourceMapping> *this)

{
  ReferenceCounterValueType RVar1;
  Char *Message;
  char (*in_RCX) [26];
  undefined1 local_30 [8];
  string msg;
  RefCountedObject<Diligent::IResourceMapping> *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->m_pRefCounters == (RefCountersImpl *)0x0) {
    FormatString<char[26],char[26]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"AddRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x221);
    std::__cxx11::string::~string((string *)local_30);
  }
  RVar1 = RefCountersImpl::AddStrongRef(this->m_pRefCounters);
  return RVar1;
}

Assistant:

AddRef() override final
    {
        VERIFY_EXPR(m_pRefCounters != nullptr);
        // Since type of m_pRefCounters is RefCountersImpl,
        // this call will not be virtual and should be inlined
        return m_pRefCounters->AddStrongRef();
    }